

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void test_performance2(void)

{
  uint uVar1;
  ostream *this;
  socklen_t in_ECX;
  string str;
  exception *ex;
  size_t i;
  person p;
  bool r;
  rpc_client client;
  person *in_stack_fffffffffffffaf8;
  string *this_00;
  string *in_stack_fffffffffffffb00;
  rpc_client *this_01;
  rpc_client *this_02;
  string local_4c8 [30];
  unsigned_short in_stack_fffffffffffffb56;
  string *in_stack_fffffffffffffb58;
  rpc_client *in_stack_fffffffffffffb60;
  string local_498 [32];
  string local_478 [47];
  allocator local_449;
  undefined4 local_448;
  string local_440 [32];
  undefined4 local_420;
  undefined4 local_414;
  byte local_40d;
  undefined1 local_3f9 [33];
  rpc_client local_3d8;
  
  this_02 = (rpc_client *)local_3f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_3f9 + 1),"127.0.0.1",(allocator *)this_02);
  rest_rpc::rpc_client::rpc_client
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb56);
  std::__cxx11::string::~string((string *)(local_3f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3f9);
  uVar1 = rest_rpc::rpc_client::connect(&local_3d8,3,(sockaddr *)0x0,in_ECX);
  local_40d = (byte)uVar1 & 1;
  if ((uVar1 & 1) == 0) {
    this = std::operator<<((ostream *)&std::cout,"connect timeout");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_414 = 1;
  }
  else {
    local_448 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_440,"tom",&local_449);
    local_420 = 0x14;
    std::allocator<char>::~allocator((allocator<char> *)&local_449);
    local_478[0x20] = (string)0x0;
    local_478[0x21] = (string)0x0;
    local_478[0x22] = (string)0x0;
    local_478[0x23] = (string)0x0;
    local_478[0x24] = (string)0x0;
    local_478[0x25] = (string)0x0;
    local_478[0x26] = (string)0x0;
    local_478[0x27] = (string)0x0;
    for (; (ulong)local_478._32_8_ < 100000000; local_478._32_8_ = local_478._32_8_ + 1) {
      this_01 = (rpc_client *)&stack0xfffffffffffffb67;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_498,"get_name",(allocator *)this_01);
      rest_rpc::rpc_client::call<std::__cxx11::string,person&>
                (this_01,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      std::__cxx11::string::~string(local_478);
      std::__cxx11::string::~string(local_498);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb67);
    }
    std::operator<<((ostream *)&std::cout,"finish\n");
    this_00 = local_4c8;
    std::__cxx11::string::string(this_00);
    std::operator>>((istream *)&std::cin,this_00);
    std::__cxx11::string::~string(local_4c8);
    person::~person((person *)0x1af007);
    local_414 = 0;
  }
  rest_rpc::rpc_client::~rpc_client(this_02);
  return;
}

Assistant:

void test_performance2() {
  rpc_client client("127.0.0.1", 9000);
  bool r = client.connect();
  if (!r) {
    std::cout << "connect timeout" << std::endl;
    return;
  }

  person p{1, "tom", 20};

  try {
    for (size_t i = 0; i < 100000000; i++) {
      client.call<std::string>("get_name", p);
    }
    std::cout << "finish\n";
  } catch (const std::exception &ex) {
    std::cout << ex.what() << '\n';
  }

  std::string str;
  std::cin >> str;
}